

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O0

TIFFReadDirEntryErr
TIFFReadDirEntryArrayWithLimit
          (TIFF *tif,TIFFDirEntry *direntry,uint32_t *count,uint32_t desttypesize,void **value,
          uint64_t maxcount)

{
  int local_7c;
  ulong local_78;
  uint64_t local_70;
  uint64_t offset_1;
  TIFFReadDirEntryErr err_1;
  uint32_t offset;
  TIFFReadDirEntryErr err;
  int original_datasize_clamped;
  uint64_t target_count64;
  void *data;
  uint32_t datasize;
  int typesize;
  uint64_t maxcount_local;
  void **value_local;
  uint32_t *puStack_28;
  uint32_t desttypesize_local;
  uint32_t *count_local;
  TIFFDirEntry *direntry_local;
  TIFF *tif_local;
  
  _datasize = maxcount;
  maxcount_local = (uint64_t)value;
  value_local._4_4_ = desttypesize;
  puStack_28 = count;
  count_local = (uint32_t *)direntry;
  direntry_local = (TIFFDirEntry *)tif;
  data._4_4_ = TIFFDataWidth((uint)direntry->tdir_type);
  if (_datasize < *(ulong *)(count_local + 2)) {
    local_78 = _datasize;
  }
  else {
    local_78 = *(ulong *)(count_local + 2);
  }
  _err = local_78;
  if ((local_78 == 0) || (data._4_4_ == 0)) {
    *(undefined8 *)maxcount_local = 0;
    tif_local._4_4_ = TIFFReadDirEntryErrOk;
  }
  else {
    if (*(ulong *)(count_local + 2) < 0xb) {
      local_7c = (int)*(undefined8 *)(count_local + 2);
    }
    else {
      local_7c = 10;
    }
    offset = local_7c * data._4_4_;
    if (0x7fffffff / (ulong)data._4_4_ < local_78) {
      tif_local._4_4_ = TIFFReadDirEntryErrSizesan;
    }
    else if (0x7fffffff / (ulong)value_local._4_4_ < local_78) {
      tif_local._4_4_ = TIFFReadDirEntryErrSizesan;
    }
    else {
      *puStack_28 = (uint)local_78;
      data._0_4_ = *puStack_28 * data._4_4_;
      if ((uint)data == 0) {
        __assert_fail("(tmsize_t)datasize > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                      ,0x51d,
                      "enum TIFFReadDirEntryErr TIFFReadDirEntryArrayWithLimit(TIFF *, TIFFDirEntry *, uint32_t *, uint32_t, void **, uint64_t)"
                     );
      }
      if ((((direntry_local->tdir_offset).toff_long & 0x800) == 0) ||
         ((ulong)(uint)data <= *(ulong *)&direntry_local[0x21].tdir_ignore)) {
        if ((((direntry_local->tdir_offset).toff_long & 0x800) == 0) &&
           (((((direntry_local->tdir_offset).toff_long & 0x80000) != 0 && (8 < (uint)data)) ||
            ((((direntry_local->tdir_offset).toff_long & 0x80000) == 0 && (4 < (uint)data)))))) {
          target_count64 = 0;
        }
        else {
          target_count64 =
               (uint64_t)
               _TIFFCheckMalloc((TIFF *)direntry_local,(ulong)*puStack_28,(long)(int)data._4_4_,
                                "ReadDirEntryArray");
          if ((void *)target_count64 == (void *)0x0) {
            return TIFFReadDirEntryErrAlloc;
          }
        }
        if (((direntry_local->tdir_offset).toff_long & 0x80000) == 0) {
          if (((int)offset < 5) && ((uint)data < 5)) {
            _TIFFmemcpy((void *)target_count64,count_local + 4,(ulong)(uint)data);
          }
          else {
            offset_1._4_4_ = count_local[4];
            if (((direntry_local->tdir_offset).toff_long & 0x80) != 0) {
              TIFFSwabLong((uint32_t *)((long)&offset_1 + 4));
            }
            if (((direntry_local->tdir_offset).toff_long & 0x800) == 0) {
              err_1 = TIFFReadDirEntryDataAndRealloc
                                ((TIFF *)direntry_local,(ulong)offset_1._4_4_,(ulong)(uint)data,
                                 (void **)&target_count64);
            }
            else {
              err_1 = TIFFReadDirEntryData
                                ((TIFF *)direntry_local,(ulong)offset_1._4_4_,(ulong)(uint)data,
                                 (void *)target_count64);
            }
            if (err_1 != TIFFReadDirEntryErrOk) {
              _TIFFfreeExt((TIFF *)direntry_local,(void *)target_count64);
              return err_1;
            }
          }
        }
        else if (((int)offset < 9) && ((uint)data < 9)) {
          _TIFFmemcpy((void *)target_count64,count_local + 4,(ulong)(uint)data);
        }
        else {
          local_70 = *(uint64_t *)(count_local + 4);
          if (((direntry_local->tdir_offset).toff_long & 0x80) != 0) {
            TIFFSwabLong8(&local_70);
          }
          if (((direntry_local->tdir_offset).toff_long & 0x800) == 0) {
            offset_1._0_4_ =
                 TIFFReadDirEntryDataAndRealloc
                           ((TIFF *)direntry_local,local_70,(ulong)(uint)data,
                            (void **)&target_count64);
          }
          else {
            offset_1._0_4_ =
                 TIFFReadDirEntryData
                           ((TIFF *)direntry_local,local_70,(ulong)(uint)data,(void *)target_count64
                           );
          }
          if ((TIFFReadDirEntryErr)offset_1 != TIFFReadDirEntryErrOk) {
            _TIFFfreeExt((TIFF *)direntry_local,(void *)target_count64);
            return (TIFFReadDirEntryErr)offset_1;
          }
        }
        *(uint64_t *)maxcount_local = target_count64;
        tif_local._4_4_ = TIFFReadDirEntryErrOk;
      }
      else {
        tif_local._4_4_ = TIFFReadDirEntryErrIo;
      }
    }
  }
  return tif_local._4_4_;
}

Assistant:

static enum TIFFReadDirEntryErr
TIFFReadDirEntryArrayWithLimit(TIFF *tif, TIFFDirEntry *direntry,
                               uint32_t *count, uint32_t desttypesize,
                               void **value, uint64_t maxcount)
{
    int typesize;
    uint32_t datasize;
    void *data;
    uint64_t target_count64;
    int original_datasize_clamped;
    typesize = TIFFDataWidth(direntry->tdir_type);

    target_count64 =
        (direntry->tdir_count > maxcount) ? maxcount : direntry->tdir_count;

    if ((target_count64 == 0) || (typesize == 0))
    {
        *value = 0;
        return (TIFFReadDirEntryErrOk);
    }
    (void)desttypesize;

    /* We just want to know if the original tag size is more than 4 bytes
     * (classic TIFF) or 8 bytes (BigTIFF)
     */
    original_datasize_clamped =
        ((direntry->tdir_count > 10) ? 10 : (int)direntry->tdir_count) *
        typesize;

    /*
     * As a sanity check, make sure we have no more than a 2GB tag array
     * in either the current data type or the dest data type.  This also
     * avoids problems with overflow of tmsize_t on 32bit systems.
     */
    if ((uint64_t)(MAX_SIZE_TAG_DATA / typesize) < target_count64)
        return (TIFFReadDirEntryErrSizesan);
    if ((uint64_t)(MAX_SIZE_TAG_DATA / desttypesize) < target_count64)
        return (TIFFReadDirEntryErrSizesan);

    *count = (uint32_t)target_count64;
    datasize = (*count) * typesize;
    assert((tmsize_t)datasize > 0);

    if (isMapped(tif) && datasize > (uint64_t)tif->tif_size)
        return TIFFReadDirEntryErrIo;

    if (!isMapped(tif) && (((tif->tif_flags & TIFF_BIGTIFF) && datasize > 8) ||
                           (!(tif->tif_flags & TIFF_BIGTIFF) && datasize > 4)))
    {
        data = NULL;
    }
    else
    {
        data = _TIFFCheckMalloc(tif, *count, typesize, "ReadDirEntryArray");
        if (data == 0)
            return (TIFFReadDirEntryErrAlloc);
    }
    if (!(tif->tif_flags & TIFF_BIGTIFF))
    {
        /* Only the condition on original_datasize_clamped. The second
         * one is implied, but Coverity Scan cannot see it. */
        if (original_datasize_clamped <= 4 && datasize <= 4)
            _TIFFmemcpy(data, &direntry->tdir_offset, datasize);
        else
        {
            enum TIFFReadDirEntryErr err;
            uint32_t offset = direntry->tdir_offset.toff_long;
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong(&offset);
            if (isMapped(tif))
                err = TIFFReadDirEntryData(tif, (uint64_t)offset,
                                           (tmsize_t)datasize, data);
            else
                err = TIFFReadDirEntryDataAndRealloc(tif, (uint64_t)offset,
                                                     (tmsize_t)datasize, &data);
            if (err != TIFFReadDirEntryErrOk)
            {
                _TIFFfreeExt(tif, data);
                return (err);
            }
        }
    }
    else
    {
        /* See above comment for the Classic TIFF case */
        if (original_datasize_clamped <= 8 && datasize <= 8)
            _TIFFmemcpy(data, &direntry->tdir_offset, datasize);
        else
        {
            enum TIFFReadDirEntryErr err;
            uint64_t offset = direntry->tdir_offset.toff_long8;
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong8(&offset);
            if (isMapped(tif))
                err = TIFFReadDirEntryData(tif, (uint64_t)offset,
                                           (tmsize_t)datasize, data);
            else
                err = TIFFReadDirEntryDataAndRealloc(tif, (uint64_t)offset,
                                                     (tmsize_t)datasize, &data);
            if (err != TIFFReadDirEntryErrOk)
            {
                _TIFFfreeExt(tif, data);
                return (err);
            }
        }
    }
    *value = data;
    return (TIFFReadDirEntryErrOk);
}